

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_types.cpp
# Opt level: O0

string * TransportTypeAsString_abi_cxx11_(TransportProtocolType transport_type)

{
  char in_SIL;
  string *in_RDI;
  long in_FS_OFFSET;
  allocator<char> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  string *psVar1;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_SIL == '\0') {
    psVar1 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar1,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    std::allocator<char>::~allocator(&local_9);
  }
  else if (in_SIL == '\x01') {
    psVar1 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar1,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    std::allocator<char>::~allocator(&local_a);
  }
  else {
    if (in_SIL != '\x02') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/connection_types.cpp"
                    ,0x27,"std::string TransportTypeAsString(TransportProtocolType)");
    }
    psVar1 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar1,(char *)CONCAT17(in_SIL,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    std::allocator<char>::~allocator(&local_b);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string TransportTypeAsString(TransportProtocolType transport_type)
{
    switch (transport_type) {
    case TransportProtocolType::DETECTING:
        return "detecting";
    case TransportProtocolType::V1:
        return "v1";
    case TransportProtocolType::V2:
        return "v2";
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}